

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O2

void __thiscall
QMdi::ControlElement<QMdi::ControlLabel>::~ControlElement(ControlElement<QMdi::ControlLabel> *this)

{
  *(undefined ***)&(this->super_ControlLabel).super_QWidget = &PTR_metaObject_007d0a80;
  *(undefined ***)&(this->super_ControlLabel).super_QWidget.super_QPaintDevice =
       &PTR__ControlElement_007d0c30;
  QWeakPointer<QObject>::~QWeakPointer(&(this->mdiChild).wp);
  ControlLabel::~ControlLabel(&this->super_ControlLabel);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }